

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmwavebs.cpp
# Opt level: O1

void __thiscall mmWaveBS::mmWaveBS(mmWaveBS *this,double x,double y,uint32_t id,Status st)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->candidacy).slots_._M_t._M_impl.super__Rb_tree_header;
  (this->candidacy).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->candidacy).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->candidacy).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->candidacy).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->candidacy).slots_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->candidacy).current_id_ = 0;
  p_Var1 = &(this->clusterHead).slots_._M_t._M_impl.super__Rb_tree_header;
  (this->clusterHead).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->clusterHead).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->clusterHead).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->clusterHead).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->clusterHead).slots_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->clusterHead).current_id_ = 0;
  p_Var1 = &(this->conflict).slots_._M_t._M_impl.super__Rb_tree_header;
  (this->conflict).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->conflict).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->conflict).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->conflict).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->conflict).slots_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->conflict).current_id_ = 0;
  (this->the_thread)._M_id._M_thread = 0;
  this->stop_thread = false;
  this->cluster_id = 0xffffffff;
  this->m_xx = x;
  this->m_yy = y;
  this->m_id = id;
  this->m_status = st;
  return;
}

Assistant:

mmWaveBS::mmWaveBS(double x, double y, uint32_t id, Status st)
: the_thread()
{
	m_xx =x; m_yy =y; m_id =id; m_status = st;
}